

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O0

bool P_MorphMonster(AActor *actor,PClassActor *spawntype,int duration,int style,
                   PClassActor *enter_flash,PClassActor *exit_flash)

{
  DDropItem **ppDVar1;
  PClassActor *type;
  bool bVar2;
  uint uVar3;
  int iVar4;
  PClassActor *local_d8;
  AMorphedMonster *local_c8;
  int local_b8;
  byte local_a1;
  DVector3 local_a0;
  AActor *local_88;
  AActor *eflash;
  TFlags<ActorRenderFlag,_unsigned_int> local_78;
  TFlags<ActorFlag3,_unsigned_int> local_74;
  TFlags<ActorFlag,_unsigned_int> local_70;
  undefined1 local_6c [4];
  TFlags<ActorFlag,_unsigned_int> local_68;
  TFlags<ActorFlag2,_unsigned_int> local_64;
  DVector3 local_60;
  TFlags<ActorFlag3,_unsigned_int> local_48;
  TFlags<ActorFlag3,_unsigned_int> local_44;
  AActor *local_40;
  AMorphedMonster *morphed;
  PClassActor *exit_flash_local;
  PClassActor *enter_flash_local;
  int style_local;
  int duration_local;
  PClassActor *spawntype_local;
  AActor *actor_local;
  
  local_a1 = 1;
  morphed = (AMorphedMonster *)exit_flash;
  exit_flash_local = enter_flash;
  enter_flash_local._0_4_ = style;
  enter_flash_local._4_4_ = duration;
  _style_local = spawntype;
  spawntype_local = (PClassActor *)actor;
  if (((actor != (AActor *)0x0) && (local_a1 = 1, actor->player == (player_t *)0x0)) &&
     (local_a1 = 1, spawntype != (PClassActor *)0x0)) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_44,
               (int)actor + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
    local_a1 = 1;
    if (uVar3 == 0) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_48,
                 (int)spawntype_local +
                 (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
      local_a1 = 1;
      if (uVar3 != 0) {
        bVar2 = PClass::IsDescendantOf
                          (&_style_local->super_PClass,AMorphedMonster::RegistrationInfo.MyClass);
        local_a1 = bVar2 ^ 0xff;
      }
    }
  }
  type = _style_local;
  if ((local_a1 & 1) == 0) {
    AActor::Pos(&local_60,(AActor *)spawntype_local);
    local_40 = Spawn(type,&local_60,NO_REPLACE);
    DObject::StaticPointerSubstitution((DObject *)spawntype_local,(DObject *)local_40);
    bVar2 = false;
    if (((uint)enter_flash_local & 0x4000) != 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_64,(int)local_40 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
      bVar2 = uVar3 == 0;
    }
    if (bVar2) {
      local_40->Translation =
           *(DWORD *)&spawntype_local[2].super_PClass.super_PStruct.super_PNamedType.
                      super_PCompoundType.super_PType.super_DObject._vptr_DObject;
    }
    local_40->tid = *(int *)&spawntype_local[1].super_PClass.SpecialInits.Array;
    TAngle<double>::operator=
              (&(local_40->Angles).Yaw,
               (TAngle<double> *)&(spawntype_local->super_PClass).super_PStruct.Fields);
    TObjPtr<AActor>::operator=((TObjPtr<AActor> *)(local_40 + 1),(AActor *)spawntype_local);
    local_40->Alpha = *(double *)&spawntype_local->NumOwnedStates;
    local_40->RenderStyle = *(FRenderStyle *)&spawntype_local->Replacement;
    local_40->Score = *(int *)((long)&spawntype_local[1].BurnHeight + 4);
    if (enter_flash_local._4_4_ == 0) {
      local_b8 = 0x578;
    }
    else {
      local_b8 = enter_flash_local._4_4_;
    }
    local_b8 = level.time + local_b8;
    iVar4 = FRandom::operator()(&pr_morphmonst);
    *(int *)&local_40[1].super_DThinker.super_DObject.Class = local_b8 + iVar4;
    *(uint *)((long)&local_40[1].super_DThinker.super_DObject.Class + 4) = (uint)enter_flash_local;
    if (morphed == (AMorphedMonster *)0x0) {
      local_c8 = (AMorphedMonster *)ATeleportFog::RegistrationInfo.MyClass;
    }
    else {
      local_c8 = morphed;
    }
    local_40[1].super_DThinker.super_DObject.ObjNext = (DObject *)local_c8;
    ppDVar1 = &spawntype_local->DropItems;
    operator~((EnumType)local_6c);
    TFlags<ActorFlag,_unsigned_int>::operator&(&local_68,(Self *)((long)ppDVar1 + 4));
    TFlags<ActorFlag,_unsigned_int>::operator=
              ((TFlags<ActorFlag,_unsigned_int> *)&local_40[1].super_DThinker.super_DObject.GCNext,
               &local_68);
    local_40->special = *(int *)((long)&spawntype_local[1].super_PClass.SpecialInits.Array + 4);
    uVar3 = spawntype_local[1].super_PClass.SpecialInits.Count;
    local_40->args[0] = spawntype_local[1].super_PClass.SpecialInits.Most;
    local_40->args[1] = uVar3;
    *(PClass **)(local_40->args + 2) = spawntype_local[1].super_PClass.ParentClass;
    local_40->args[4] = *(int *)&spawntype_local[1].super_PClass.Pointers;
    AActor::CopyFriendliness(local_40,(AActor *)spawntype_local,true,true);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_70,
               (int)spawntype_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    TFlags<ActorFlag,_unsigned_int>::operator|=(&local_40->flags,&local_70);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_74,
               (int)spawntype_local +
               (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
    TFlags<ActorFlag3,_unsigned_int>::operator|=(&local_40->flags3,&local_74);
    TFlags<ActorRenderFlag,_unsigned_int>::operator&(&local_78,(int)spawntype_local + 0xec);
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_78);
    if (uVar3 != 0) {
      TFlags<ActorFlag,_unsigned_int>::operator|=
                ((TFlags<ActorFlag,_unsigned_int> *)&local_40[1].super_DThinker.super_DObject.GCNext
                 ,MF_JUSTHIT);
    }
    AActor::AddToHash(local_40);
    AActor::RemoveFromHash((AActor *)spawntype_local);
    *(undefined4 *)((long)&spawntype_local[1].super_PClass.SpecialInits.Array + 4) = 0;
    *(undefined4 *)&spawntype_local[1].super_PClass.SpecialInits.Array = 0;
    operator|((EnumType)&eflash,MF_SOLID);
    TFlags<ActorFlag,_unsigned_int>::operator~
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&eflash + 4));
    TFlags<ActorFlag,_unsigned_int>::operator&=
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&spawntype_local->DropItems + 4),
               (Self *)((long)&eflash + 4));
    TFlags<ActorFlag,_unsigned_int>::operator|=
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&spawntype_local->DropItems + 4),
               MF_UNMORPHED);
    TFlags<ActorRenderFlag,_unsigned_int>::operator|=
              ((TFlags<ActorRenderFlag,_unsigned_int> *)((long)&spawntype_local->Replacement + 4),
               RF_INVISIBLE);
    if (exit_flash_local == (PClassActor *)0x0) {
      local_d8 = (PClassActor *)ATeleportFog::RegistrationInfo.MyClass;
    }
    else {
      local_d8 = exit_flash_local;
    }
    AActor::PosPlusZ(&local_a0,(AActor *)spawntype_local,gameinfo.telefogheight);
    local_88 = Spawn(local_d8,&local_a0,ALLOW_REPLACE);
    if (local_88 != (AActor *)0x0) {
      TObjPtr<AActor>::operator=(&local_88->target,local_40);
    }
    actor_local._7_1_ = true;
  }
  else {
    actor_local._7_1_ = false;
  }
  return actor_local._7_1_;
}

Assistant:

bool P_MorphMonster (AActor *actor, PClassActor *spawntype, int duration, int style, PClassActor *enter_flash, PClassActor *exit_flash)
{
	AMorphedMonster *morphed;

	if (actor == NULL || actor->player || spawntype == NULL ||
		actor->flags3 & MF3_DONTMORPH ||
		!(actor->flags3 & MF3_ISMONSTER) ||
		!spawntype->IsDescendantOf (RUNTIME_CLASS(AMorphedMonster)))
	{
		return false;
	}

	morphed = static_cast<AMorphedMonster *>(Spawn (spawntype, actor->Pos(), NO_REPLACE));
	DObject::StaticPointerSubstitution (actor, morphed);
	if ((style & MORPH_TRANSFERTRANSLATION) && !(morphed->flags2 & MF2_DONTTRANSLATE))
	{
		morphed->Translation = actor->Translation;
	}
	morphed->tid = actor->tid;
	morphed->Angles.Yaw = actor->Angles.Yaw;
	morphed->UnmorphedMe = actor;
	morphed->Alpha = actor->Alpha;
	morphed->RenderStyle = actor->RenderStyle;
	morphed->Score = actor->Score;

	morphed->UnmorphTime = level.time + ((duration) ? duration : MORPHTICS) + pr_morphmonst();
	morphed->MorphStyle = style;
	morphed->MorphExitFlash = (exit_flash) ? exit_flash : RUNTIME_CLASS(ATeleportFog);
	morphed->FlagsSave = actor->flags & ~MF_JUSTHIT;
	morphed->special = actor->special;
	memcpy (morphed->args, actor->args, sizeof(actor->args));
	morphed->CopyFriendliness (actor, true);
	morphed->flags |= actor->flags & MF_SHADOW;
	morphed->flags3 |= actor->flags3 & MF3_GHOST;
	if (actor->renderflags & RF_INVISIBLE)
	{
		morphed->FlagsSave |= MF_JUSTHIT;
	}
	morphed->AddToHash ();
	actor->RemoveFromHash ();
	actor->special = 0;
	actor->tid = 0;
	actor->flags &= ~(MF_SOLID|MF_SHOOTABLE);
	actor->flags |= MF_UNMORPHED;
	actor->renderflags |= RF_INVISIBLE;
	AActor *eflash = Spawn(((enter_flash) ? enter_flash : RUNTIME_CLASS(ATeleportFog)), actor->PosPlusZ(TELEFOGHEIGHT), ALLOW_REPLACE);
	if (eflash)
		eflash->target = morphed;
	return true;
}